

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_2,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  int col_1;
  bool bVar3;
  long lVar4;
  float *pfVar5;
  int col;
  long lVar6;
  float fVar7;
  float fVar8;
  float v;
  float fVar9;
  float fVar10;
  Vector<float,_4> res;
  float local_48 [4];
  Type in1;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar7 = (evalCtx->coords).m_data[0];
    fVar8 = (evalCtx->coords).m_data[1];
  }
  else {
    fVar7 = 1.2;
    fVar8 = 0.5;
  }
  pfVar1 = in1.m_data.m_data[0].m_data + 1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    pfVar5 = (float *)&in1;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar6 = 0;
      do {
        fVar10 = 1.0;
        if (lVar4 != lVar6) {
          fVar10 = 0.0;
        }
        pfVar5[lVar6 * 2] = fVar10;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = 1;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
    in1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in1.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    in1.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    in1.m_data.m_data[2].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[1] = 0.0;
    in1.m_data.m_data[3].m_data[0] = 0.0;
    in1.m_data.m_data[3].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    lVar4 = 0;
    pfVar5 = (float *)&in1;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar6 = 0;
      do {
        pfVar5[lVar6 * 2] = *(float *)((long)&DAT_00af0b40 + lVar6 * 4 + lVar4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = 0x10;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
  }
  lVar4 = 0;
  do {
    fVar9 = 0.0;
    lVar6 = 0;
    fVar10 = fVar7;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      fVar9 = fVar9 + fVar10 * in1.m_data.m_data[lVar4].m_data[lVar6];
      lVar6 = 1;
      fVar10 = fVar8;
      bVar2 = false;
    } while (bVar3);
    res.m_data[lVar4] = fVar9;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar4]] = res.m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}